

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

void __thiscall pktalloc::Allocator::moveLastFewWindowsToFull(Allocator *this,uint count)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint in_ESI;
  long in_RDI;
  WindowHeader *window;
  uint windowIndex;
  uint i;
  uint existingPreferredCount;
  uint existingFullCount;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffbc;
  
  iVar1 = *(int *)(in_RDI + 0x1b0);
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_Copy
            ((LightVector<pktalloc::Allocator::WindowHeader_*> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb4
            );
  iVar2 = *(int *)(in_RDI + 0xd0);
  for (uVar4 = 0; uVar4 < in_ESI; uVar4 = uVar4 + 1) {
    in_stack_ffffffffffffffb4 = (iVar2 + -1) - uVar4;
    lVar3 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)(int)in_stack_ffffffffffffffb4 * 8);
    *(long *)(*(long *)(in_RDI + 0x1b8) + (long)(int)(iVar1 + uVar4) * 8) = lVar3;
    *(uint *)(lVar3 + 0x108) = iVar1 + uVar4;
  }
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_Copy
            ((LightVector<pktalloc::Allocator::WindowHeader_*> *)CONCAT44(iVar2,uVar4),
             in_stack_ffffffffffffffb4);
  return;
}

Assistant:

void Allocator::moveLastFewWindowsToFull(unsigned count)
{
    const unsigned existingFullCount = FullWindows.GetSize();
    FullWindows.SetSize_Copy(existingFullCount + count);

    const unsigned existingPreferredCount = PreferredWindows.GetSize();
    PKTALLOC_DEBUG_ASSERT(existingPreferredCount >= count);

    // For each window to move:
    for (unsigned i = 0; i < count; ++i)
    {
        const unsigned windowIndex = existingPreferredCount - 1 - i;
        PKTALLOC_DEBUG_ASSERT(windowIndex < PreferredWindows.GetSize());
        WindowHeader* window = PreferredWindows.GetRef(windowIndex);
        PKTALLOC_DEBUG_ASSERT(window);

        // Move the window to the full list
        FullWindows.GetRef(existingFullCount + i) = window;
        window->FullListIndex = existingFullCount + i;
    }

    PreferredWindows.SetSize_Copy(existingPreferredCount - count);

    ALLOC_DEBUG_INTEGRITY_CHECK();
}